

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_bitmapblit_template<unsigned_int>
               (QRasterBuffer *rasterBuffer,int x,int y,uint color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  undefined4 in_register_00000034;
  int iVar6;
  quint32 qVar7;
  undefined4 in_register_0000008c;
  int iVar8;
  int iVar9;
  int x_1;
  ulong uVar10;
  long lVar11;
  int in_stack_00000018;
  
  qVar7 = (quint32)map;
  pcVar4 = (char *)CONCAT44(in_register_0000008c,mapWidth);
  lVar11 = (long)(int)color * (long)rasterBuffer + CONCAT44(in_register_00000034,x) + (long)y * 4;
  iVar6 = (int)((ulong)rasterBuffer >> 2);
  if (mapHeight < 9) {
    if (0 < mapStride) {
      do {
        cVar5 = *pcVar4;
        if (cVar5 != '\0') {
          iVar9 = 0;
          iVar8 = 0;
          do {
            if (cVar5 < '\0') {
              iVar9 = iVar9 + 1;
            }
            else {
              if (iVar9 == 0) {
                iVar8 = iVar8 + 1;
              }
              else {
                (*qt_memfill32)((quint32 *)(lVar11 + (long)iVar8 * 4),qVar7,(long)iVar9);
                iVar8 = iVar8 + 1 + iVar9;
              }
              iVar9 = 0;
            }
            cVar5 = cVar5 * '\x02';
          } while (cVar5 != '\0');
          if (iVar9 != 0) {
            (*qt_memfill32)((quint32 *)(lVar11 + (long)iVar8 * 4),qVar7,(long)iVar9);
          }
        }
        lVar11 = lVar11 + (long)iVar6 * 4;
        pcVar4 = pcVar4 + in_stack_00000018;
        bVar1 = 1 < mapStride;
        mapStride = mapStride + -1;
      } while (bVar1);
    }
  }
  else if (0 < mapStride) {
    do {
      uVar10 = 0;
      iVar8 = 0;
      iVar9 = 0;
LAB_0066fa24:
      do {
        cVar5 = pcVar4[uVar10 >> 3];
        iVar3 = -8;
        do {
          if (cVar5 < '\0') {
            iVar8 = iVar8 + 1;
          }
          else {
            if (iVar8 == 0) {
              iVar2 = 1;
            }
            else {
              (*qt_memfill32)((quint32 *)(lVar11 + (long)iVar9 * 4),qVar7,(long)iVar8);
              iVar2 = iVar8 + 1;
            }
            if (cVar5 == '\0') {
              iVar9 = (iVar8 + iVar9) - iVar3;
              uVar10 = uVar10 + 8;
              iVar8 = 0;
              if (mapHeight <= (int)uVar10) goto LAB_0066fabe;
              goto LAB_0066fa24;
            }
            iVar9 = iVar9 + iVar2;
            iVar8 = 0;
          }
          cVar5 = cVar5 * '\x02';
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0);
        uVar10 = uVar10 + 8;
      } while ((int)uVar10 < mapHeight);
      if (iVar8 != 0) {
        (*qt_memfill32)((quint32 *)(lVar11 + (long)iVar9 * 4),qVar7,(long)iVar8);
      }
LAB_0066fabe:
      lVar11 = lVar11 + (long)iVar6 * 4;
      pcVar4 = pcVar4 + in_stack_00000018;
      bVar1 = 1 < mapStride;
      mapStride = mapStride + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

static
inline void qt_bitmapblit_template(QRasterBuffer *rasterBuffer,
                                   int x, int y, DST color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    DST *dest = reinterpret_cast<DST *>(rasterBuffer->scanLine(y)) + x;
    const int destStride = rasterBuffer->stride<DST>();

    if (mapWidth > 8) {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (int x = 0; x < mapWidth; x += 8) {
                uchar s = map[x >> 3];
                for (int i = 0; i < 8; ++i) {
                    if (s & 0x80) {
                        ++n;
                    } else {
                        if (n) {
                            qt_memfill(dest + x0, color, n);
                            x0 += n + 1;
                            n = 0;
                        } else {
                            ++x0;
                        }
                        if (!s) {
                            x0 += 8 - 1 - i;
                            break;
                        }
                    }
                    s <<= 1;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    } else {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (uchar s = *map; s; s <<= 1) {
                if (s & 0x80) {
                    ++n;
                } else if (n) {
                    qt_memfill(dest + x0, color, n);
                    x0 += n + 1;
                    n = 0;
                } else {
                    ++x0;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    }
}